

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day-or-night.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int b;
  int g;
  int r;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar1 = __isoc99_scanf("%d,%d,%d",&local_3c,&local_38,&local_34);
  if (iVar1 == -1) {
    dVar5 = NAN;
  }
  else {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar2 = lVar2 + (local_38 + local_34 + local_3c) / 3;
      lVar4 = lVar4 + 1;
      iVar1 = __isoc99_scanf("%d,%d,%d",&local_3c,&local_38,&local_34);
    } while (iVar1 != -1);
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  }
  pcVar3 = "night";
  if (0.3 < dVar5 / 255.0) {
    pcVar3 = "day";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar3,(ulong)(dVar5 / 255.0 <= 0.3) * 2 + 3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  int r, g, b;
  uint64_t total_gray = 0,  pixels = 0;
  while (std::scanf("%d,%d,%d", &b, &g, &r) != EOF) {
    total_gray += (r + g + b) / 3;
    pixels += 1;
  }
  const double rate = double(total_gray) / double(pixels) / 255;
  std::cout << (rate > 0.3 ? "day" : "night") << std::endl;
  return 0;
}